

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::restriction
          (MLNodeLaplacian *this,int amrlev,int cmglev,MultiFab *crse,MultiFab *fine)

{
  DistributionMapping *rhs;
  pointer pIVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Periodicity *period;
  int iVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  char cVar15;
  ulong uVar16;
  undefined **ppuVar17;
  int iVar18;
  undefined4 in_register_00000034;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  MLNodeLaplacian *pMVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  undefined1 auVar90 [16];
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar114;
  undefined1 auVar108 [16];
  double dVar107;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar126;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  double dVar149;
  double dVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  double dVar156;
  double dVar157;
  double dVar158;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  double dVar159;
  double dVar171;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  double dVar172;
  double dVar173;
  double dVar174;
  undefined1 auVar177 [16];
  double dVar175;
  double dVar181;
  undefined1 auVar178 [16];
  double dVar176;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  double dVar182;
  double dVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  double dVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  int kk_3;
  int jj;
  int kk_1;
  int kk;
  Array4<double> cfab;
  MFIter mfi;
  MultiFab cfine;
  ulong in_stack_fffffffffffff8d8;
  ulong local_6b8;
  Box local_5d4;
  double local_5b8;
  undefined8 uStack_5b0;
  long local_5a8;
  double *local_5a0;
  ulong local_598;
  long local_590;
  long local_588;
  long local_580;
  undefined **local_578;
  double *local_570;
  double *local_568;
  double *local_560;
  double local_558;
  undefined8 uStack_550;
  FabArray<amrex::FArrayBox> *local_540;
  ulong local_538;
  ulong local_530;
  double *local_528;
  double *local_520;
  double *local_518;
  undefined **local_510;
  uint local_508;
  int local_504;
  int local_500;
  int local_4fc;
  double local_4f8;
  undefined8 uStack_4f0;
  FabArray<amrex::FArrayBox> *local_4e0;
  MLNodeLaplacian *local_4d8;
  ulong local_4d0;
  undefined **local_4c8;
  undefined **local_4c0;
  long local_4b8;
  long local_4b0;
  undefined1 local_4a8 [24];
  pointer local_490;
  undefined8 uStack_488;
  int local_480;
  Array4<const_double> local_468;
  Array4<const_int> local_428;
  double *local_3e8;
  undefined8 uStack_3e0;
  double *local_3d8;
  undefined8 uStack_3d0;
  double *local_3c8;
  undefined8 uStack_3c0;
  double *local_3b8;
  undefined8 uStack_3b0;
  double *local_3a8;
  undefined8 uStack_3a0;
  double local_398;
  undefined8 uStack_390;
  FabArray<amrex::FArrayBox> *local_388;
  long local_380;
  FabArray<amrex::IArrayBox> *local_378;
  Arena *local_370;
  long local_368;
  long local_360;
  long local_358;
  int *local_350;
  long local_348;
  double *local_340;
  ulong local_338;
  long local_330;
  long local_328;
  long local_320;
  double *local_318;
  int *local_310;
  undefined **local_308;
  double *local_300;
  double *local_2f8;
  double *local_2f0;
  double *local_2e8;
  double *local_2e0;
  double *local_2d8;
  double *local_2d0;
  double *local_2c8;
  double *local_2c0;
  double *local_2b8;
  double *local_2b0;
  double *local_2a8;
  double *local_2a0;
  double *local_298;
  double *local_290;
  double *local_288;
  double *local_280;
  double *local_278;
  double *local_270;
  double *local_268;
  double *local_260;
  Array4<const_double> local_258;
  BoxArray local_218;
  FabArray<amrex::FArrayBox> local_1b0;
  
  local_4d8 = this;
  (*(this->super_MLNodeLinOp).super_MLLinOp._vptr_MLLinOp[0x45])
            (this,CONCAT44(in_register_00000034,amrlev),(ulong)(cmglev - 1U),fine,0,0,
             in_stack_fffffffffffff8d8 & 0xffffffff00000000);
  rhs = &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  bVar4 = DistributionMapping::operator==
                    (&(crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                     rhs);
  bVar41 = (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_4e0 = &fine->super_FabArray<amrex::FArrayBox>;
  MultiFab::MultiFab((MultiFab *)&local_1b0);
  local_540 = &crse->super_FabArray<amrex::FArrayBox>;
  local_388 = &crse->super_FabArray<amrex::FArrayBox>;
  if (bVar41 || !bVar4) {
    amrex::coarsen(&local_218,
                   &(((FabArray<amrex::FArrayBox> *)&local_4e0->super_FabArrayBase)->
                    super_FabArrayBase).boxarray,2);
    local_4a8._0_8_ = (double *)0x1;
    local_4a8._8_8_ = (Arena *)0x0;
    local_4a8._16_8_ = (pointer)0x0;
    local_490 = (pointer)0x0;
    uStack_488 = (pointer)0x0;
    local_468.p = (double *)&PTR__FabFactory_00712918;
    local_540 = &local_1b0;
    MultiFab::define((MultiFab *)local_540,&local_218,rhs,1,0,(MFInfo *)local_4a8,
                     (FabFactory<amrex::FArrayBox> *)&local_468);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4a8 + 0x10));
    BoxArray::~BoxArray(&local_218);
  }
  pMVar36 = local_4d8;
  local_5a8 = (long)(int)(cmglev - 1U);
  cVar15 = '\x02';
  if (cmglev < 1) {
    bVar42 = true;
  }
  else {
    pIVar1 = (local_4d8->super_MLNodeLinOp).super_MLLinOp.mg_coarsen_ratio_vec.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pIVar1[local_5a8].vect[1] == 2 && pIVar1[local_5a8].vect[0] == 2) {
      bVar42 = pIVar1[local_5a8].vect[2] == 2;
    }
    else {
      if (pIVar1[local_5a8].vect[1] == 1) {
        cVar15 = '\x01';
      }
      else {
        cVar15 = (pIVar1[local_5a8].vect[0] != 1) * '\x02';
      }
      bVar42 = false;
    }
  }
  local_378 = *(FabArray<amrex::IArrayBox> **)
               (*(long *)&(local_4d8->super_MLNodeLinOp).m_dirichlet_mask.
                          super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[amrlev].
                          super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               + local_5a8 * 8);
  local_380 = *(long *)&(local_4d8->m_stencil).
                        super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ;
  MFIter::MFIter((MFIter *)&local_218,&local_540->super_FabArrayBase,true);
  if (local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
      local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) {
    do {
      MFIter::tilebox(&local_5d4,(MFIter *)&local_218);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_4a8,local_540,(MFIter *)&local_218);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_468,local_4e0,(MFIter *)&local_218);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_428,local_378,(MFIter *)&local_218);
      if ((pMVar36->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
        if (bVar42) {
          local_510 = (undefined **)CONCAT44(local_510._4_4_,local_5d4.bigend.vect[2]);
          if (local_5d4.smallend.vect[2] <= local_5d4.bigend.vect[2]) {
            local_598 = (ulong)(uint)local_5d4.smallend.vect[1];
            lVar23 = (long)local_5d4.smallend.vect[0];
            iVar6 = (local_5d4.bigend.vect[0] - local_5d4.smallend.vect[0]) + 1;
            local_578 = (undefined **)CONCAT44(local_578._4_4_,iVar6);
            local_580 = lVar23 * 0x10;
            local_5a0 = (double *)CONCAT44(local_5a0._4_4_,local_5d4.smallend.vect[2] * 2);
            iVar2 = local_5d4.smallend.vect[2] * 2 + 1;
            local_5b8 = (double)CONCAT44(local_5b8._4_4_,local_5d4.smallend.vect[2] * 2 + -1);
            iVar10 = local_5d4.smallend.vect[1] * 2 + 1;
            local_518 = (double *)CONCAT44(local_518._4_4_,iVar10);
            local_588 = CONCAT44(local_588._4_4_,local_5d4.smallend.vect[0] * 2);
            iVar7 = local_5d4.smallend.vect[0] * 2 + -1;
            local_590 = CONCAT44(local_590._4_4_,iVar7);
            uVar5 = local_5d4.smallend.vect[2];
            do {
              if (local_5d4.smallend.vect[1] <= local_5d4.bigend.vect[1]) {
                iVar9 = uVar5 * 2;
                local_558 = (double)CONCAT44(local_558._4_4_,iVar9);
                iVar8 = uVar5 * 2 + 1;
                local_4f8 = (double)CONCAT44(local_4f8._4_4_,iVar8);
                local_568 = (double *)(local_4a8._8_8_ * 8);
                local_560 = (double *)-(long)uStack_488._4_4_;
                local_570 = (double *)
                            (local_428.p +
                            lVar23 * 2 +
                            (((long)(int)local_5a0 - (long)local_428.begin.z) * local_428.kstride -
                            (long)local_428.begin.x));
                local_6b8 = local_598;
                iVar18 = local_5d4.smallend.vect[1] * 2 + -1;
                iVar39 = iVar10;
                iVar24 = local_5d4.smallend.vect[1] * 2;
                do {
                  if (local_5d4.smallend.vect[0] <= local_5d4.bigend.vect[0]) {
                    lVar29 = (~local_468.begin.z + iVar9) * local_468.kstride;
                    lVar30 = (iVar8 - local_468.begin.z) * local_468.kstride;
                    lVar40 = (iVar9 - local_468.begin.z) * local_468.kstride;
                    lVar25 = local_468.kstride * 8;
                    lVar37 = ((long)(int)local_5a0 - (long)local_468.begin.z) * lVar25;
                    lVar33 = (iVar2 - local_468.begin.z) * lVar25;
                    lVar25 = (local_5b8._0_4_ - local_468.begin.z) * lVar25;
                    lVar20 = (int)(~local_468.begin.y + (uint)local_6b8 * 2) * local_468.jstride;
                    lVar14 = (int)(((uint)local_6b8 * 2 + 1) - local_468.begin.y) *
                             local_468.jstride;
                    lVar19 = (int)((uint)local_6b8 * 2 - local_468.begin.y) * local_468.jstride;
                    lVar11 = local_468.jstride * 8;
                    lVar28 = ((long)iVar24 - (long)local_468.begin.y) * lVar11;
                    lVar12 = (iVar39 - local_468.begin.y) * lVar11;
                    lVar11 = (iVar18 - local_468.begin.y) * lVar11;
                    lVar22 = (long)local_468.begin.x;
                    lVar21 = 0;
                    iVar27 = iVar6;
                    do {
                      dVar53 = 0.0;
                      if (*(int *)((long)local_570 +
                                  lVar21 * 4 +
                                  ((long)iVar24 - (long)local_428.begin.y) * local_428.jstride * 4)
                          == 0) {
                        lVar26 = (long)((iVar7 - local_468.begin.x) + (int)lVar21);
                        lVar38 = (long)((local_5d4.smallend.vect[0] * 2 - local_468.begin.x) + 1 +
                                       (int)lVar21);
                        dVar53 = *(double *)
                                  ((long)local_468.p +
                                  lVar21 * 8 + lVar37 + lVar28 + lVar22 * -8 + local_580) * 0.125 +
                                 ((double)local_468.p[lVar19 + lVar26 + lVar40] +
                                  (double)local_468.p[lVar19 + lVar38 + lVar40] +
                                  *(double *)
                                   ((long)local_468.p +
                                   lVar21 * 8 + lVar37 + lVar11 + lVar22 * -8 + local_580) +
                                  *(double *)
                                   ((long)local_468.p +
                                   lVar21 * 8 + lVar37 + lVar12 + lVar22 * -8 + local_580) +
                                  *(double *)
                                   ((long)local_468.p +
                                   lVar21 * 8 + lVar28 + lVar25 + lVar22 * -8 + local_580) +
                                 *(double *)
                                  ((long)local_468.p +
                                  lVar21 * 8 + lVar28 + lVar33 + lVar22 * -8 + local_580)) * 0.0625
                                 + ((double)local_468.p[lVar20 + lVar26 + lVar29] +
                                    (double)local_468.p[lVar20 + lVar38 + lVar29] +
                                    (double)local_468.p[lVar14 + lVar26 + lVar29] +
                                    (double)local_468.p[lVar14 + lVar38 + lVar29] +
                                    (double)local_468.p[lVar20 + lVar26 + lVar30] +
                                    (double)local_468.p[lVar20 + lVar38 + lVar30] +
                                    (double)local_468.p[lVar14 + lVar26 + lVar30] +
                                   (double)local_468.p[lVar14 + lVar38 + lVar30]) * 0.015625 +
                                   (*(double *)
                                     ((long)local_468.p +
                                     lVar21 * 8 + lVar11 + lVar25 + lVar22 * -8 + local_580) +
                                    *(double *)
                                     ((long)local_468.p +
                                     lVar21 * 8 + lVar12 + lVar25 + lVar22 * -8 + local_580) +
                                    *(double *)
                                     ((long)local_468.p +
                                     lVar21 * 8 + lVar33 + lVar11 + lVar22 * -8 + local_580) +
                                    *(double *)
                                     ((long)local_468.p +
                                     lVar21 * 8 + lVar12 + lVar33 + lVar22 * -8 + local_580) +
                                    (double)local_468.p[lVar19 + lVar26 + lVar29] +
                                    (double)local_468.p[lVar19 + lVar38 + lVar29] +
                                    (double)local_468.p[lVar19 + lVar26 + lVar30] +
                                    (double)local_468.p[lVar19 + lVar38 + lVar30] +
                                    (double)local_468.p[lVar20 + lVar26 + lVar40] +
                                    (double)local_468.p[lVar20 + lVar38 + lVar40] +
                                    (double)local_468.p[lVar14 + lVar26 + lVar40] +
                                   (double)local_468.p[lVar14 + lVar38 + lVar40]) * 0.03125;
                      }
                      *(double *)
                       (local_4a8._0_8_ +
                       lVar21 * 4 +
                       ((long)local_560 + (long)(int)(uint)local_6b8) * (long)local_568 +
                       ((long)(int)uVar5 - (long)local_480) * local_4a8._16_8_ * 8 +
                       (long)(int)uStack_488 * -8 + lVar23 * 8) = dVar53;
                      lVar21 = lVar21 + 2;
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                  iVar24 = iVar24 + 2;
                  iVar39 = iVar39 + 2;
                  iVar18 = iVar18 + 2;
                  bVar43 = (uint)local_6b8 != local_5d4.bigend.vect[1];
                  local_6b8 = (ulong)((uint)local_6b8 + 1);
                } while (bVar43);
              }
              local_5a0 = (double *)CONCAT44(local_5a0._4_4_,(int)local_5a0 + 2);
              iVar2 = iVar2 + 2;
              local_5b8 = (double)CONCAT44(local_5b8._4_4_,local_5b8._0_4_ + 2);
              bVar43 = uVar5 != local_5d4.bigend.vect[2];
              uVar5 = uVar5 + 1;
            } while (bVar43);
          }
        }
        else {
          local_558 = (double)CONCAT44(local_558._4_4_,local_5d4.bigend.vect[2]);
          if (local_5d4.smallend.vect[2] <= local_5d4.bigend.vect[2]) {
            iVar2 = local_5d4.smallend.vect[0] * 2;
            iVar10 = (local_5d4.bigend.vect[0] - local_5d4.smallend.vect[0]) + 1;
            local_5b8 = (double)CONCAT44(local_5b8._4_4_,iVar10);
            uVar5 = local_5d4.smallend.vect[2];
            do {
              if (local_5d4.smallend.vect[1] <= local_5d4.bigend.vect[1]) {
                lVar23 = (long)(int)uVar5;
                iVar6 = (int)(lVar23 * 2);
                uVar3 = local_5d4.smallend.vect[1];
                do {
                  if (local_5d4.smallend.vect[0] <= local_5d4.bigend.vect[0]) {
                    lVar40 = (long)(int)uVar3;
                    iVar7 = (int)(lVar40 * 2);
                    lVar21 = (long)local_428.begin.y;
                    lVar12 = (long)local_428.begin.z;
                    lVar11 = (~local_468.begin.y + iVar7) * local_468.jstride;
                    lVar33 = (iVar7 - local_468.begin.y) * local_468.jstride;
                    lVar22 = ((iVar7 + 1) - local_468.begin.y) * local_468.jstride;
                    lVar25 = (lVar40 - local_468.begin.y) * local_468.jstride;
                    lVar14 = (~local_468.begin.z + iVar6) * local_468.kstride;
                    lVar19 = (iVar6 - local_468.begin.z) * local_468.kstride;
                    lVar20 = ((iVar6 + 1) - local_468.begin.z) * local_468.kstride;
                    lVar28 = (lVar23 - local_468.begin.z) * local_468.kstride;
                    uVar13 = ~local_468.begin.x;
                    iVar35 = local_5d4.smallend.vect[0] - local_468.begin.x;
                    iVar8 = -local_468.begin.x;
                    iVar32 = local_5d4.smallend.vect[0] - local_428.begin.x;
                    iVar9 = -local_428.begin.x;
                    iVar27 = local_5d4.smallend.vect[0] - (int)uStack_488;
                    iVar24 = iVar10;
                    iVar39 = iVar9;
                    uVar31 = uVar13;
                    iVar18 = iVar8;
                    do {
                      if (cVar15 == '\0') {
                        dVar53 = 0.0;
                        if (local_428.p
                            [(lVar40 * 2 - lVar21) * local_428.jstride +
                             (lVar23 * 2 - lVar12) * local_428.kstride + (long)iVar32] == 0) {
                          lVar37 = (long)iVar35;
                          dVar53 = local_468.p[lVar33 + lVar37 + lVar20] +
                                   (double)local_468.p[lVar33 + lVar37 + lVar20] +
                                   local_468.p[lVar22 + lVar37 + lVar19] +
                                   (double)local_468.p[lVar22 + lVar37 + lVar19] +
                                   (double)local_468.p[lVar33 + lVar37 + lVar19] * 4.0 +
                                   local_468.p[lVar11 + lVar37 + lVar19] +
                                   (double)local_468.p[lVar11 + lVar37 + lVar19] +
                                   local_468.p[lVar33 + lVar37 + lVar14] +
                                   (double)local_468.p[lVar33 + lVar37 + lVar14] +
                                   (double)local_468.p[lVar11 + lVar37 + lVar14] +
                                   (double)local_468.p[lVar22 + lVar37 + lVar14] +
                                   (double)local_468.p[lVar11 + lVar37 + lVar20];
                          ppuVar17 = (undefined **)(local_468.p + lVar22 + lVar37 + lVar20);
                          goto LAB_005688c7;
                        }
                      }
                      else if (cVar15 == '\x01') {
                        dVar53 = 0.0;
                        if (local_428.p
                            [(lVar40 - lVar21) * local_428.jstride +
                             (iVar6 - lVar12) * local_428.kstride + (long)(iVar2 + iVar9)] == 0) {
                          lVar37 = (long)(int)(iVar2 + uVar13);
                          lVar29 = (long)(iVar2 + iVar8);
                          lVar30 = (long)(iVar2 + 1 + iVar8);
                          dVar53 = local_468.p[lVar25 + lVar29 + lVar20] +
                                   (double)local_468.p[lVar25 + lVar29 + lVar20] +
                                   local_468.p[lVar25 + lVar30 + lVar19] +
                                   (double)local_468.p[lVar25 + lVar30 + lVar19] +
                                   (double)local_468.p[lVar25 + lVar29 + lVar19] * 4.0 +
                                   local_468.p[lVar25 + lVar37 + lVar19] +
                                   (double)local_468.p[lVar25 + lVar37 + lVar19] +
                                   local_468.p[lVar25 + lVar29 + lVar14] +
                                   (double)local_468.p[lVar25 + lVar29 + lVar14] +
                                   (double)local_468.p[lVar25 + lVar37 + lVar14] +
                                   (double)local_468.p[lVar25 + lVar30 + lVar14] +
                                   (double)local_468.p[lVar25 + lVar37 + lVar20];
                          ppuVar17 = (undefined **)(local_468.p + lVar25 + lVar30 + lVar20);
LAB_005688c7:
                          dVar53 = (dVar53 + (double)*ppuVar17) * 0.0625;
                        }
                      }
                      else {
                        dVar53 = 0.0;
                        if (local_428.p
                            [(iVar7 - lVar21) * local_428.jstride +
                             (lVar23 - lVar12) * local_428.kstride + (long)(iVar2 + iVar39)] == 0) {
                          lVar37 = (long)(int)(iVar2 + uVar31);
                          lVar29 = (long)(iVar2 + iVar18);
                          lVar30 = (long)(iVar2 + 1 + iVar18);
                          dVar53 = local_468.p[lVar22 + lVar28 + lVar29] +
                                   (double)local_468.p[lVar22 + lVar28 + lVar29] +
                                   local_468.p[lVar33 + lVar28 + lVar30] +
                                   (double)local_468.p[lVar33 + lVar28 + lVar30] +
                                   (double)local_468.p[lVar33 + lVar28 + lVar29] * 4.0 +
                                   local_468.p[lVar33 + lVar28 + lVar37] +
                                   (double)local_468.p[lVar33 + lVar28 + lVar37] +
                                   local_468.p[lVar11 + lVar28 + lVar29] +
                                   (double)local_468.p[lVar11 + lVar28 + lVar29] +
                                   (double)local_468.p[lVar11 + lVar28 + lVar37] +
                                   (double)local_468.p[lVar11 + lVar28 + lVar30] +
                                   (double)local_468.p[lVar22 + lVar28 + lVar37];
                          ppuVar17 = (undefined **)(local_468.p + lVar22 + lVar28 + lVar30);
                          goto LAB_005688c7;
                        }
                      }
                      *(double *)
                       (local_4a8._0_8_ +
                       ((lVar40 - uStack_488._4_4_) * local_4a8._8_8_ +
                       (lVar23 - local_480) * local_4a8._16_8_ + (long)iVar27) * 8) = dVar53;
                      iVar18 = iVar18 + 2;
                      uVar31 = uVar31 + 2;
                      iVar39 = iVar39 + 2;
                      iVar8 = iVar8 + 2;
                      uVar13 = uVar13 + 2;
                      iVar9 = iVar9 + 2;
                      iVar35 = iVar35 + 1;
                      iVar27 = iVar27 + 1;
                      iVar32 = iVar32 + 1;
                      iVar24 = iVar24 + -1;
                    } while (iVar24 != 0);
                  }
                  bVar43 = uVar3 != local_5d4.bigend.vect[1];
                  uVar3 = uVar3 + 1;
                } while (bVar43);
              }
              bVar43 = uVar5 != local_5d4.bigend.vect[2];
              uVar5 = uVar5 + 1;
            } while (bVar43);
          }
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_258,*(FabArray<amrex::FArrayBox> **)(local_380 + local_5a8 * 8),
                   (MFIter *)&local_218);
        local_508 = local_5d4.bigend.vect[2];
        local_538 = (ulong)(uint)local_5d4.smallend.vect[2];
        if (local_5d4.smallend.vect[2] <= local_5d4.bigend.vect[2]) {
          local_338 = (ulong)(uint)local_5d4.bigend.vect[0];
          local_4d0 = (ulong)local_5d4.smallend.vect[0];
          do {
            if (local_5d4.smallend.vect[1] <= local_5d4.bigend.vect[1]) {
              local_348 = (long)(int)(uint)local_538 * 2;
              iVar2 = (int)local_348;
              local_4fc = iVar2 + -2;
              local_500 = iVar2 + -1;
              local_504 = iVar2 + 1;
              local_4b0 = (long)local_428.begin.x;
              local_358 = (long)local_428.begin.y;
              local_350 = local_428.p + (local_348 - local_428.begin.z) * local_428.kstride;
              local_360 = local_428.jstride;
              local_4b8 = (long)(int)uStack_488;
              local_368 = (long)uStack_488._4_4_;
              local_370 = (Arena *)local_4a8._8_8_;
              local_340 = (double *)
                          (local_4a8._0_8_ +
                          ((long)(int)(uint)local_538 - (long)local_480) * local_4a8._16_8_ * 8);
              local_530 = (ulong)(uint)local_5d4.smallend.vect[1];
              do {
                if (local_5d4.smallend.vect[0] <= local_5d4.bigend.vect[0]) {
                  lVar23 = (long)(int)(uint)local_530 * 2;
                  iVar10 = (int)lVar23;
                  lVar14 = (iVar10 - local_468.begin.y) * local_468.jstride;
                  lVar33 = local_258.jstride * (iVar10 - local_258.begin.y);
                  local_560 = local_258.p + ((iVar10 - local_258.begin.y) + -2) * local_258.jstride;
                  local_568 = local_258.p + ((iVar10 + -1) - local_258.begin.y) * local_258.jstride;
                  local_570 = local_258.p + ((iVar10 + 1) - local_258.begin.y) * local_258.jstride;
                  local_578 = (undefined **)
                              (local_468.p + ((iVar10 + -1) - local_468.begin.y) * local_468.jstride
                              );
                  local_308 = (undefined **)
                              (local_468.p + ((iVar10 + 1) - local_468.begin.y) * local_468.jstride)
                  ;
                  lVar40 = (iVar2 - local_258.begin.z) * local_258.kstride;
                  lVar19 = (local_4fc - local_258.begin.z) * local_258.kstride;
                  lVar20 = (local_500 - local_258.begin.z) * local_258.kstride;
                  lVar21 = (local_504 - local_258.begin.z) * local_258.kstride;
                  local_580 = (iVar2 - local_468.begin.z) * local_468.kstride;
                  lVar22 = (local_500 - local_468.begin.z) * local_468.kstride;
                  lVar28 = (local_504 - local_468.begin.z) * local_468.kstride;
                  local_310 = local_350 + (lVar23 - local_358) * local_428.jstride;
                  local_318 = local_340 + ((int)(uint)local_530 - local_368) * local_4a8._8_8_;
                  local_320 = local_258.nstride * 8;
                  local_330 = local_258.nstride * 7;
                  lVar23 = (long)local_468.begin.x;
                  local_328 = (long)local_258.begin.x;
                  local_4c0 = local_578 + local_580;
                  local_4c8 = local_308 + local_580;
                  local_588 = local_258.nstride * 5;
                  local_590 = local_258.nstride * 6;
                  uVar34 = local_4d0;
                  do {
                    uVar16 = uVar34 * 2;
                    dVar53 = 0.0;
                    if (local_310[uVar16 - local_4b0] == 0) {
                      lVar37 = uVar16 - lVar23;
                      lVar11 = (long)(((int)uVar16 - local_258.begin.x) + -2);
                      lVar25 = uVar16 - 1;
                      lVar12 = lVar25 - local_328;
                      dVar53 = local_258.p[lVar33 + lVar12 + lVar40 + local_258.nstride];
                      if (((local_258.p[lVar33 + lVar11 + lVar40 + local_258.nstride] != 0.0) ||
                          (dVar53 != 0.0)) || (NAN(dVar53))) {
                        dVar53 = ((double)local_468.p[lVar14 + local_580 + (lVar25 - lVar23)] *
                                 ABS(dVar53)) /
                                 (ABS(local_258.p[lVar33 + lVar11 + lVar40 + local_258.nstride]) +
                                 ABS(dVar53));
                      }
                      else {
                        dVar53 = (double)local_468.p[lVar14 + local_580 + (lVar25 - lVar23)] * 0.5;
                      }
                      lVar29 = uVar16 - local_328;
                      uVar16 = uVar16 | 1;
                      dVar54 = local_258.p[lVar33 + lVar29 + lVar40 + local_258.nstride];
                      dVar55 = (local_258.p + lVar33 + lVar29 + lVar40 + local_258.nstride)[1];
                      if (((dVar54 != 0.0) || (NAN(dVar54))) || ((dVar55 != 0.0 || (NAN(dVar55)))))
                      {
                        dVar54 = ((double)local_468.p[lVar14 + local_580 + (uVar16 - lVar23)] *
                                 ABS(dVar54)) / (ABS(dVar55) + ABS(dVar54));
                      }
                      else {
                        dVar54 = (double)local_468.p[lVar14 + local_580 + (uVar16 - lVar23)] * 0.5;
                      }
                      local_2c0 = local_560 + lVar29;
                      dVar55 = local_2c0[lVar40 + local_258.nstride * 2];
                      dVar56 = local_568[lVar29 + lVar40 + local_258.nstride * 2];
                      if (((dVar55 != 0.0) || (NAN(dVar55))) || ((dVar56 != 0.0 || (NAN(dVar56)))))
                      {
                        dVar55 = ((double)local_4c0[lVar37] * ABS(dVar56)) /
                                 (ABS(dVar55) + ABS(dVar56));
                      }
                      else {
                        dVar55 = (double)local_4c0[lVar37] * 0.5;
                      }
                      dVar56 = local_258.p[lVar33 + lVar29 + lVar40 + local_258.nstride * 2];
                      local_2d8 = local_570 + lVar29;
                      dVar57 = local_2d8[lVar40 + local_258.nstride * 2];
                      if ((((dVar56 != 0.0) || (NAN(dVar56))) || (dVar57 != 0.0)) || (NAN(dVar57)))
                      {
                        dVar56 = ((double)local_4c8[lVar37] * ABS(dVar56)) /
                                 (ABS(dVar56) + ABS(dVar57));
                      }
                      else {
                        dVar56 = (double)local_4c8[lVar37] * 0.5;
                      }
                      dVar57 = local_258.p[lVar33 + lVar29 + lVar19 + local_258.nstride * 3];
                      dVar58 = local_258.p[lVar33 + lVar29 + lVar20 + local_258.nstride * 3];
                      if (((dVar57 != 0.0) || (NAN(dVar57))) || ((dVar58 != 0.0 || (NAN(dVar58)))))
                      {
                        dVar57 = ((double)local_468.p[lVar14 + lVar37 + lVar22] * ABS(dVar58)) /
                                 (ABS(dVar57) + ABS(dVar58));
                      }
                      else {
                        dVar57 = (double)local_468.p[lVar14 + lVar37 + lVar22] * 0.5;
                      }
                      lVar30 = uVar16 - local_328;
                      dVar58 = local_258.p[lVar33 + lVar29 + lVar40 + local_258.nstride * 3];
                      local_2d0 = local_258.p + lVar33 + lVar29 + lVar21;
                      dVar44 = local_2d0[local_258.nstride * 3];
                      if (((dVar58 != 0.0) || (NAN(dVar58))) || ((dVar44 != 0.0 || (NAN(dVar44)))))
                      {
                        dVar58 = ((double)local_468.p[lVar14 + lVar37 + lVar28] * ABS(dVar58)) /
                                 (ABS(dVar58) + ABS(dVar44));
                      }
                      else {
                        dVar58 = (double)local_468.p[lVar14 + lVar37 + lVar28] * 0.5;
                      }
                      local_280 = local_568 + lVar11 + lVar40;
                      local_5a0 = local_560 + lVar11;
                      local_270 = local_5a0 + lVar40;
                      dVar91 = ABS(local_270[local_258.nstride * 4]);
                      dVar59 = ABS(local_280[local_258.nstride * 4]);
                      local_288 = local_568 + lVar12 + lVar40;
                      local_278 = local_560 + lVar12 + lVar40;
                      dVar115 = ABS(local_278[local_258.nstride * 4]);
                      dVar99 = ABS(local_288[local_258.nstride * 4]);
                      dVar127 = ABS(local_278[local_258.nstride * 2]) / (dVar91 + dVar115 + 1e-100);
                      dVar136 = ABS(local_288[local_258.nstride * 2]) / (dVar59 + dVar99 + 1e-100);
                      dVar67 = ABS(local_280[local_258.nstride]) / (dVar91 + dVar59 + 1e-100) + 1.0;
                      dVar85 = ABS(local_288[local_258.nstride]) / (dVar115 + dVar99 + 1e-100) + 1.0
                      ;
                      dVar99 = (dVar85 + dVar136) * dVar99;
                      lVar25 = lVar25 - lVar23;
                      local_510 = local_578 + lVar25;
                      dVar92 = ABS(local_2c0[lVar40 + local_258.nstride * 4]);
                      dVar44 = ABS(local_568[lVar29 + lVar40 + local_258.nstride * 4]);
                      local_2b8 = local_568 + lVar30 + lVar40;
                      local_518 = local_560 + lVar30;
                      local_2b0 = local_518 + lVar40;
                      dVar128 = ABS(local_2b0[local_258.nstride * 4]);
                      dVar100 = ABS(local_2b8[local_258.nstride * 4]);
                      dVar116 = ABS(local_2b0[local_258.nstride * 2]) / (dVar92 + dVar128 + 1e-100);
                      dVar137 = ABS(local_2b8[local_258.nstride * 2]) / (dVar44 + dVar100 + 1e-100);
                      dVar68 = ABS(local_568[lVar29 + lVar40 + local_258.nstride]) /
                               (dVar92 + dVar44 + 1e-100) + 1.0;
                      dVar86 = ABS(local_2b8[local_258.nstride]) / (dVar128 + dVar100 + 1e-100) +
                               1.0;
                      dVar44 = (dVar68 + dVar137) * dVar44;
                      lVar38 = uVar16 - lVar23;
                      local_260 = local_570 + lVar11;
                      local_2f0 = local_260 + lVar40;
                      dVar101 = ABS(local_258.p[lVar33 + lVar11 + lVar40 + local_258.nstride * 4]);
                      dVar93 = ABS(local_2f0[local_258.nstride * 4]);
                      local_2c8 = local_570 + lVar12;
                      local_2e0 = local_2c8 + lVar40;
                      dVar129 = ABS(local_258.p[lVar33 + lVar12 + lVar40 + local_258.nstride * 4]);
                      dVar117 = ABS(local_2e0[local_258.nstride * 4]);
                      dVar60 = ABS(local_258.p[lVar33 + lVar12 + lVar40 + local_258.nstride * 2]) /
                               (dVar101 + dVar129 + 1e-100);
                      dVar138 = ABS(local_2e0[local_258.nstride * 2]) / (dVar93 + dVar117 + 1e-100);
                      dVar69 = ABS(local_2f0[local_258.nstride]) / (dVar101 + dVar93 + 1e-100) + 1.0
                      ;
                      dVar87 = ABS(local_2e0[local_258.nstride]) / (dVar129 + dVar117 + 1e-100) +
                               1.0;
                      dVar129 = (dVar60 + dVar87) * dVar129;
                      dVar45 = ABS(local_2d8[lVar40 + local_258.nstride * 4]);
                      dVar102 = ABS(local_258.p[lVar33 + lVar29 + lVar40 + local_258.nstride * 4]);
                      local_268 = local_570 + lVar30;
                      local_2f8 = local_268 + lVar40;
                      dVar118 = ABS(local_2f8[local_258.nstride * 4]);
                      dVar130 = ABS(local_258.p[lVar33 + lVar30 + lVar40 + local_258.nstride * 4]);
                      dVar94 = ABS(local_258.p[lVar33 + lVar30 + lVar40 + local_258.nstride * 2]) /
                               (dVar102 + dVar130 + 1e-100);
                      dVar139 = ABS(local_2f8[local_258.nstride * 2]) / (dVar45 + dVar118 + 1e-100);
                      dVar70 = ABS(local_2d8[lVar40 + local_258.nstride]) /
                               (dVar45 + dVar102 + 1e-100) + 1.0;
                      dVar102 = (dVar70 + dVar94) * dVar102;
                      dVar88 = ABS(local_2f8[local_258.nstride]) / (dVar118 + dVar130 + 1e-100) +
                               1.0;
                      local_2a0 = local_258.p + lVar33 + lVar11 + lVar20;
                      local_290 = local_258.p + lVar33 + lVar11 + lVar19;
                      dVar61 = ABS(local_290[local_258.nstride * 5]);
                      dVar71 = ABS(local_2a0[local_258.nstride * 5]);
                      uStack_3a0 = 0;
                      local_298 = local_258.p + lVar33 + lVar12 + lVar20;
                      local_2a8 = local_258.p + lVar33 + lVar12 + lVar19;
                      dVar182 = ABS(local_2a8[local_258.nstride * 5]);
                      dVar172 = ABS(local_298[local_258.nstride * 5]);
                      dVar190 = ABS(local_2a8[local_258.nstride * 3]) / (dVar61 + dVar182 + 1e-100);
                      dVar195 = ABS(local_298[local_258.nstride * 3]) / (dVar71 + dVar172 + 1e-100);
                      dVar89 = ABS(local_2a0[local_258.nstride]) / (dVar61 + dVar71 + 1e-100) + 1.0;
                      local_300 = local_258.p + lVar33 + lVar11 + lVar21;
                      dVar46 = ABS(local_300[local_258.nstride * 5]);
                      uStack_3b0 = 0;
                      dVar156 = ABS(local_258.p[lVar33 + lVar11 + lVar40 + local_258.nstride * 5]);
                      dVar62 = ABS(local_258.p[lVar33 + lVar12 + lVar21 + local_258.nstride * 5]);
                      uStack_3c0 = 0;
                      dVar47 = ABS(local_258.p[lVar33 + lVar12 + lVar40 + local_258.nstride * 5]);
                      dVar63 = ABS(local_258.p[lVar33 + lVar12 + lVar40 + local_258.nstride * 3]) /
                               (dVar156 + dVar47 + 1e-100);
                      dVar95 = ABS(local_300[local_258.nstride]) / (dVar46 + dVar156 + 1e-100) + 1.0
                      ;
                      dVar72 = ABS(local_258.p[lVar33 + lVar12 + lVar21 + local_258.nstride]) /
                               (dVar62 + dVar47 + 1e-100) + 1.0;
                      uStack_3e0 = 0;
                      dVar47 = (dVar63 + dVar72) * dVar47;
                      dVar149 = ABS(local_298[local_258.nstride]) / (dVar182 + dVar172 + 1e-100) +
                                1.0;
                      dVar172 = (dVar149 + dVar195) * dVar172;
                      dVar103 = ABS(local_258.p[lVar33 + lVar29 + lVar19 + local_258.nstride * 5]);
                      dVar48 = ABS(local_258.p[lVar33 + lVar29 + lVar20 + local_258.nstride * 5]);
                      local_3a8 = local_258.p + lVar33 + lVar30 + lVar20;
                      local_2e8 = local_258.p + lVar33 + lVar30 + lVar19;
                      dVar150 = ABS(local_2e8[local_258.nstride * 5]);
                      dVar73 = ABS(local_3a8[local_258.nstride * 5]);
                      uStack_3d0 = 0;
                      dVar196 = ABS(local_2e8[local_258.nstride * 3]) / (dVar103 + dVar150 + 1e-100)
                      ;
                      dVar74 = ABS(local_3a8[local_258.nstride * 3]) / (dVar48 + dVar73 + 1e-100);
                      dVar173 = ABS(local_258.p[lVar33 + lVar29 + lVar20 + local_258.nstride]) /
                                (dVar103 + dVar48 + 1e-100) + 1.0;
                      dVar183 = ABS(local_3a8[local_258.nstride]) / (dVar150 + dVar73 + 1e-100) +
                                1.0;
                      dVar48 = (dVar173 + dVar74) * dVar48;
                      dVar104 = ABS(local_258.p[lVar33 + lVar12 + lVar21 + local_258.nstride * 3]) /
                                (dVar46 + dVar62 + 1e-100);
                      dVar96 = ABS(local_2d0[local_258.nstride * 5]);
                      dVar49 = ABS(local_258.p[lVar33 + lVar29 + lVar40 + local_258.nstride * 5]);
                      dVar119 = ABS(local_258.p[lVar33 + lVar30 + lVar21 + local_258.nstride * 5]);
                      dVar140 = ABS(local_258.p[lVar33 + lVar30 + lVar40 + local_258.nstride * 5]);
                      dVar157 = ABS(local_258.p[lVar33 + lVar30 + lVar40 + local_258.nstride * 3]) /
                                (dVar49 + dVar140 + 1e-100);
                      dVar174 = ABS(local_258.p[lVar33 + lVar30 + lVar21 + local_258.nstride * 3]) /
                                (dVar96 + dVar119 + 1e-100);
                      dVar75 = ABS(local_2d0[local_258.nstride]) / (dVar96 + dVar49 + 1e-100) + 1.0;
                      dVar49 = (dVar75 + dVar157) * dVar49;
                      dVar105 = ABS(local_258.p[lVar33 + lVar30 + lVar21 + local_258.nstride]) /
                                (dVar119 + dVar140 + 1e-100) + 1.0;
                      local_3b8 = local_2c0 + lVar20;
                      dVar158 = ABS(local_3b8[local_258.nstride * 6]);
                      local_3d8 = local_2d8 + lVar20;
                      dVar76 = ABS(local_3d8[local_258.nstride * 6]);
                      local_520 = local_2c0 + lVar19;
                      dVar106 = ABS(local_520[local_258.nstride * 6]);
                      dVar114 = ABS(local_258.p[lVar33 + lVar29 + lVar19 + local_258.nstride * 6]);
                      dVar50 = ABS(local_3b8[local_258.nstride * 2]) / (dVar106 + dVar158 + 1e-100)
                               + 1.0;
                      local_528 = local_568 + lVar29 + lVar20;
                      dVar120 = ABS(local_528[local_258.nstride * 6]);
                      dVar126 = ABS(local_258.p[lVar33 + lVar29 + lVar20 + local_258.nstride * 6]);
                      auVar165._0_8_ = ABS(local_528[local_258.nstride * 3]);
                      auVar165._8_8_ = ABS(local_3d8[local_258.nstride * 3]);
                      auVar177._0_8_ = dVar120 + dVar158 + 1e-100;
                      auVar177._8_8_ = dVar76 + dVar126 + 1e-100;
                      auVar97 = divpd(auVar165,auVar177);
                      auVar160._0_8_ = ABS(local_528[local_258.nstride * 2]);
                      auVar160._8_8_ =
                           ABS(local_258.p[lVar33 + lVar29 + lVar20 + local_258.nstride * 2]);
                      local_3c8 = local_568 + lVar29 + lVar19;
                      local_3e8 = local_2d8 + lVar19;
                      dVar175 = ABS(local_3c8[local_258.nstride * 6]);
                      dVar181 = ABS(local_3e8[local_258.nstride * 6]);
                      auVar191._0_8_ = dVar175 + dVar120 + 1e-100;
                      auVar191._8_8_ = dVar126 + dVar114 + 1e-100;
                      auVar161 = divpd(auVar160,auVar191);
                      auVar184._0_8_ = ABS(local_3c8[local_258.nstride * 3]);
                      auVar184._8_8_ = ABS(local_3e8[local_258.nstride * 3]);
                      auVar192._0_8_ = dVar106 + dVar175 + 1e-100;
                      auVar192._8_8_ = dVar114 + dVar181 + 1e-100;
                      auVar185 = divpd(auVar184,auVar192);
                      dVar159 = auVar161._0_8_ + 1.0;
                      dVar171 = auVar161._8_8_ + 1.0;
                      dVar64 = ABS(local_3d8[local_258.nstride * 2]) / (dVar181 + dVar76 + 1e-100) +
                               1.0;
                      dVar120 = (auVar97._0_8_ + dVar159) * dVar120;
                      dVar126 = (auVar97._8_8_ + dVar171) * dVar126;
                      auVar161._0_8_ = (double)local_578[lVar37 + lVar22] * dVar120;
                      auVar161._8_8_ = (double)local_308[lVar37 + lVar22] * dVar126;
                      auVar167._0_8_ =
                           dVar120 + (dVar50 + auVar97._0_8_) * dVar158 +
                                     (dVar159 + auVar185._0_8_) * dVar175 +
                                     (dVar50 + auVar185._0_8_) * dVar106 + 1e-100;
                      auVar167._8_8_ =
                           (auVar97._8_8_ + dVar64) * dVar76 +
                           dVar126 + (dVar64 + auVar185._8_8_) * dVar181 +
                                     (dVar171 + auVar185._8_8_) * dVar114 + 1e-100;
                      auVar161 = divpd(auVar161,auVar167);
                      dVar50 = ABS(local_2c0[lVar40 + local_258.nstride * 6]);
                      dVar114 = ABS(local_2d8[lVar40 + local_258.nstride * 6]);
                      dVar106 = ABS(local_2c0[lVar21 + local_258.nstride * 6]);
                      dVar120 = ABS(local_2d0[local_258.nstride * 6]);
                      dVar181 = ABS(local_2c0[lVar21 + local_258.nstride * 2]) /
                                (dVar106 + dVar50 + 1e-100) + 1.0;
                      dVar64 = ABS(local_568[lVar29 + lVar40 + local_258.nstride * 6]);
                      dVar76 = ABS(local_258.p[lVar33 + lVar29 + lVar40 + local_258.nstride * 6]);
                      auVar162._0_8_ = ABS(local_568[lVar29 + lVar40 + local_258.nstride * 3]);
                      auVar162._8_8_ = ABS(local_2d8[lVar40 + local_258.nstride * 3]);
                      auVar187._0_8_ = dVar64 + dVar50 + 1e-100;
                      auVar187._8_8_ = dVar114 + dVar76 + 1e-100;
                      auVar163 = divpd(auVar162,auVar187);
                      auVar124._0_8_ = ABS(local_568[lVar29 + lVar21 + local_258.nstride * 2]);
                      auVar124._8_8_ = ABS(local_2d0[local_258.nstride * 2]);
                      dVar159 = ABS(local_568[lVar29 + lVar21 + local_258.nstride * 6]);
                      dVar171 = ABS(local_2d8[lVar21 + local_258.nstride * 6]);
                      auVar90._0_8_ = dVar159 + dVar64 + 1e-100;
                      auVar90._8_8_ = dVar76 + dVar120 + 1e-100;
                      auVar185 = divpd(auVar124,auVar90);
                      local_398 = local_2d8[lVar21 + local_258.nstride * 7];
                      uStack_390 = 0;
                      auVar111._0_8_ = ABS(local_568[lVar29 + lVar21 + local_258.nstride * 3]);
                      auVar111._8_8_ = ABS(local_2d8[lVar21 + local_258.nstride * 3]);
                      auVar178._0_8_ = dVar106 + dVar159 + 1e-100;
                      auVar178._8_8_ = dVar171 + dVar120 + 1e-100;
                      auVar97 = divpd(auVar111,auVar178);
                      dVar126 = auVar185._0_8_ + 1.0;
                      dVar158 = auVar185._8_8_ + 1.0;
                      dVar64 = (auVar163._0_8_ + dVar126) * dVar64;
                      dVar76 = (auVar163._8_8_ + dVar158) * dVar76;
                      dVar175 = ABS(local_2d8[lVar21 + local_258.nstride * 2]) /
                                (dVar171 + dVar114 + 1e-100) + 1.0;
                      local_558 = local_2f0[local_258.nstride * 7];
                      uStack_550 = 0;
                      auVar185._0_8_ =
                           dVar64 + (dVar181 + auVar163._0_8_) * dVar50 +
                           (dVar181 + auVar97._0_8_) * dVar106 + (dVar126 + auVar97._0_8_) * dVar159
                           + 1e-100;
                      auVar185._8_8_ =
                           (auVar163._8_8_ + dVar175) * dVar114 + dVar76 +
                           (dVar158 + auVar97._8_8_) * dVar120 + (dVar175 + auVar97._8_8_) * dVar171
                           + 1e-100;
                      auVar152._8_8_ = (double)local_308[lVar37 + lVar28] * dVar76;
                      auVar152._0_8_ = (double)local_578[lVar37 + lVar28] * dVar64;
                      auVar90 = divpd(auVar152,auVar185);
                      dVar158 = ABS(local_258.p[lVar33 + lVar29 + lVar40 + local_258.nstride * 7]);
                      dVar141 = ABS(local_2d0[local_258.nstride * 7]);
                      auVar163._8_4_ = SUB84(dVar158,0);
                      auVar163._0_8_ = dVar158;
                      auVar163._12_4_ = (int)((ulong)dVar158 >> 0x20);
                      dVar50 = dVar158 + ABS(local_258.p
                                             [lVar33 + lVar30 + lVar40 + local_258.nstride * 7]);
                      dVar76 = auVar163._8_8_ + ABS(local_2d8[lVar40 + local_258.nstride * 7]);
                      local_4f8 = local_258.p[lVar33 + lVar12 + lVar21 + local_258.nstride * 4];
                      uStack_4f0 = 0;
                      auVar164._0_8_ =
                           ABS(local_258.p[lVar33 + lVar30 + lVar40 + local_258.nstride * 6]);
                      auVar164._8_8_ = ABS(local_2d8[lVar40 + local_258.nstride * 5]);
                      auVar66._0_8_ = dVar50 + 1e-100;
                      auVar66._8_8_ = dVar76 + 1e-100;
                      auVar165 = divpd(auVar164,auVar66);
                      dVar181 = ABS(local_258.p[lVar33 + lVar12 + lVar40 + local_258.nstride * 7]);
                      dVar159 = ABS(local_258.p[lVar33 + lVar12 + lVar21 + local_258.nstride * 7]);
                      auVar133._8_4_ = SUB84(dVar181,0);
                      auVar133._0_8_ = dVar181;
                      auVar133._12_4_ = (int)((ulong)dVar181 >> 0x20);
                      dVar106 = dVar181 + ABS(local_258.p
                                              [lVar33 + lVar11 + lVar40 + local_258.nstride * 7]);
                      dVar120 = auVar133._8_8_ + ABS(local_2e0[local_258.nstride * 7]);
                      local_5b8 = local_560[lVar12 + lVar21 + local_258.nstride * 7];
                      uStack_5b0 = 0;
                      auVar151._0_8_ =
                           ABS(local_258.p[lVar33 + lVar12 + lVar40 + local_258.nstride * 6]);
                      auVar151._8_8_ = ABS(local_2e0[local_258.nstride * 5]);
                      auVar135._0_8_ = dVar106 + 1e-100;
                      auVar135._8_8_ = dVar120 + 1e-100;
                      auVar152 = divpd(auVar151,auVar135);
                      dVar176 = ABS(local_568[lVar29 + lVar40 + local_258.nstride * 7]);
                      dVar142 = ABS(local_568[lVar29 + lVar21 + local_258.nstride * 7]);
                      dVar171 = ABS(local_2b8[local_258.nstride * 7]) + dVar176;
                      dVar175 = dVar176 + ABS(local_2c0[lVar40 + local_258.nstride * 7]);
                      auVar132._0_8_ = ABS(local_568[lVar29 + lVar21 + local_258.nstride * 4]);
                      auVar132._8_8_ = ABS(local_2b8[local_258.nstride * 3]);
                      auVar108._0_8_ = dVar176 + dVar142 + 1e-100;
                      auVar108._8_8_ =
                           ABS(local_2c0[lVar40 + local_258.nstride * 7]) +
                           ABS(local_2b0[local_258.nstride * 7]) + dVar176 +
                           ABS(local_2b8[local_258.nstride * 7]) + 1e-100;
                      auVar133 = divpd(auVar132,auVar108);
                      auVar166._0_8_ = ABS(local_2b8[local_258.nstride * 6]);
                      auVar166._8_8_ = ABS(local_568[lVar29 + lVar40 + local_258.nstride * 5]);
                      auVar154._0_8_ = dVar171 + 1e-100;
                      auVar154._8_8_ = dVar175 + 1e-100;
                      auVar167 = divpd(auVar166,auVar154);
                      dVar114 = ABS(local_288[local_258.nstride * 7]);
                      dVar197 = ABS(local_280[local_258.nstride * 7]) + dVar114;
                      dVar198 = dVar114 + ABS(local_278[local_258.nstride * 7]);
                      dVar107 = ABS(local_568[lVar12 + lVar21 + local_258.nstride * 7]);
                      auVar82._8_4_ = SUB84(dVar114,0);
                      auVar82._0_8_ = dVar114;
                      auVar82._12_4_ = (int)((ulong)dVar114 >> 0x20);
                      auVar186._0_8_ = ABS(local_568[lVar12 + lVar21 + local_258.nstride * 4]);
                      auVar186._8_8_ = ABS(local_288[local_258.nstride * 3]);
                      auVar109._0_8_ = dVar107 + dVar114 + 1e-100;
                      auVar109._8_8_ =
                           ABS(local_278[local_258.nstride * 7]) +
                           ABS(local_270[local_258.nstride * 7]) +
                           ABS(local_280[local_258.nstride * 7]) + auVar82._8_8_ + 1e-100;
                      auVar187 = divpd(auVar186,auVar109);
                      auVar153._0_8_ = ABS(local_288[local_258.nstride * 6]);
                      auVar153._8_8_ = ABS(local_288[local_258.nstride * 5]);
                      auVar97._8_8_ = dVar198 + 1e-100;
                      auVar97._0_8_ = dVar197 + 1e-100;
                      auVar154 = divpd(auVar153,auVar97);
                      dVar143 = ABS(local_258.p[lVar33 + lVar29 + lVar19 + local_258.nstride * 7]);
                      dVar64 = ABS(local_3d8[local_258.nstride * 7]);
                      dVar121 = ABS(local_258.p[lVar33 + lVar29 + lVar20 + local_258.nstride * 7]);
                      auVar84._0_8_ = ABS(local_3a8[local_258.nstride * 2]);
                      auVar84._8_8_ = ABS(local_3d8[local_258.nstride]);
                      auVar188._8_4_ = SUB84(dVar143,0);
                      auVar188._0_8_ = dVar143;
                      auVar188._12_4_ = (int)((ulong)dVar143 >> 0x20);
                      auVar77._8_4_ = SUB84(dVar121,0);
                      auVar77._0_8_ = dVar121;
                      auVar77._12_4_ = (int)((ulong)dVar121 >> 0x20);
                      auVar189._0_8_ =
                           dVar143 + ABS(local_2e8[local_258.nstride * 7]) + dVar121 +
                           ABS(local_3a8[local_258.nstride * 7]) + 1e-100;
                      auVar189._8_8_ =
                           auVar188._8_8_ + ABS(local_3e8[local_258.nstride * 7]) + auVar77._8_8_ +
                           dVar64 + 1e-100;
                      auVar97 = divpd(auVar84,auVar189);
                      auVar134._0_8_ =
                           ABS(local_258.p[lVar33 + lVar29 + lVar20 + local_258.nstride * 4]);
                      auVar134._8_8_ = ABS(local_268[lVar20 + local_258.nstride * 3]);
                      dVar126 = dVar121 + ABS(local_3a8[local_258.nstride * 7]);
                      auVar144._0_8_ = dVar143 + dVar121 + 1e-100;
                      auVar144._8_8_ =
                           dVar64 + dVar126 + ABS(local_268[lVar20 + local_258.nstride * 7]) +
                           1e-100;
                      auVar135 = divpd(auVar134,auVar144);
                      auVar110._0_8_ = ABS(local_3a8[local_258.nstride * 6]);
                      auVar110._8_8_ = ABS(local_3d8[local_258.nstride * 5]);
                      auVar78._0_8_ = dVar126 + 1e-100;
                      auVar78._8_8_ = auVar77._8_8_ + dVar64 + 1e-100;
                      auVar111 = divpd(auVar110,auVar78);
                      dVar143 = ABS(local_2a8[local_258.nstride * 7]);
                      dVar131 = ABS(local_298[local_258.nstride * 7]);
                      dVar126 = ABS(local_2c8[lVar20 + local_258.nstride * 7]);
                      auVar146._8_4_ = SUB84(dVar143,0);
                      auVar146._0_8_ = dVar143;
                      auVar146._12_4_ = (int)((ulong)dVar143 >> 0x20);
                      auVar194._0_8_ = ABS(local_2c8[lVar20 + local_258.nstride]);
                      auVar194._8_8_ = ABS(local_298[local_258.nstride * 2]);
                      auVar170._0_8_ =
                           dVar126 + dVar131 + dVar143 + ABS(local_2c8[lVar19 + local_258.nstride *
                                                                                7]) + 1e-100;
                      auVar170._8_8_ =
                           dVar131 + ABS(local_2a0[local_258.nstride * 7]) +
                                     auVar146._8_8_ + ABS(local_290[local_258.nstride * 7]) + 1e-100
                      ;
                      auVar163 = divpd(auVar194,auVar170);
                      auVar180._8_4_ = SUB84(dVar131,0);
                      auVar180._0_8_ = dVar131;
                      auVar180._12_4_ = (int)((ulong)dVar131 >> 0x20);
                      dVar64 = dVar131 + ABS(local_2a0[local_258.nstride * 7]);
                      auVar193._0_8_ = ABS(local_298[local_258.nstride * 4]);
                      auVar193._8_8_ = ABS(local_2c8[lVar20 + local_258.nstride * 3]);
                      auVar168._0_8_ = dVar131 + dVar143 + 1e-100;
                      auVar168._8_8_ =
                           ABS(local_260[lVar20 + local_258.nstride * 7]) + dVar64 + dVar126 +
                           1e-100;
                      auVar194 = divpd(auVar193,auVar168);
                      auVar145._0_8_ = ABS(local_298[local_258.nstride * 6]);
                      auVar145._8_8_ = ABS(local_2c8[lVar20 + local_258.nstride * 5]);
                      auVar51._0_8_ = dVar64 + 1e-100;
                      auVar51._8_8_ = auVar180._8_8_ + dVar126 + 1e-100;
                      auVar146 = divpd(auVar145,auVar51);
                      dVar122 = ABS(local_528[local_258.nstride * 7]);
                      dVar143 = ABS(local_3b8[local_258.nstride * 7]);
                      dVar64 = ABS(local_3c8[local_258.nstride * 7]);
                      dVar126 = ABS(local_568[lVar30 + lVar20 + local_258.nstride * 7]);
                      auVar147._8_4_ = SUB84(dVar64,0);
                      auVar147._0_8_ = dVar64;
                      auVar147._12_4_ = (int)((ulong)dVar64 >> 0x20);
                      auVar169._0_8_ = ABS(local_568[lVar30 + lVar20 + local_258.nstride * 2]);
                      auVar169._8_8_ = ABS(local_528[local_258.nstride]);
                      auVar148._0_8_ =
                           dVar64 + ABS(local_568[lVar30 + lVar19 + local_258.nstride * 7]) +
                           dVar122 + dVar126 + 1e-100;
                      auVar148._8_8_ =
                           auVar147._8_8_ + ABS(local_520[local_258.nstride * 7]) + dVar143 +
                           dVar122 + 1e-100;
                      auVar170 = divpd(auVar169,auVar148);
                      auVar65._0_8_ = ABS(local_528[local_258.nstride * 4]);
                      auVar65._8_8_ = ABS(local_568[lVar30 + lVar20 + local_258.nstride * 3]);
                      auVar155._0_8_ = dVar122 + dVar64 + 1e-100;
                      auVar155._8_8_ =
                           dVar143 + ABS(local_518[lVar20 + local_258.nstride * 7]) + dVar122 +
                           dVar126 + 1e-100;
                      auVar66 = divpd(auVar65,auVar155);
                      auVar179._0_8_ = ABS(local_568[lVar30 + lVar20 + local_258.nstride * 6]);
                      auVar179._8_8_ = ABS(local_528[local_258.nstride * 5]);
                      auVar112._0_8_ = dVar126 + dVar122 + 1e-100;
                      auVar112._8_8_ = dVar122 + dVar143 + 1e-100;
                      auVar180 = divpd(auVar179,auVar112);
                      dVar123 = ABS(local_568[lVar12 + lVar19 + local_258.nstride * 7]);
                      dVar143 = ABS(local_568[lVar11 + lVar20 + local_258.nstride * 7]);
                      dVar64 = ABS(local_568[lVar12 + lVar20 + local_258.nstride * 7]);
                      dVar126 = ABS(local_560[lVar12 + lVar20 + local_258.nstride * 7]);
                      auVar52._0_8_ = ABS(local_568[lVar12 + lVar20 + local_258.nstride]);
                      auVar52._8_8_ = ABS(local_568[lVar12 + lVar20 + local_258.nstride * 2]);
                      auVar79._8_4_ = SUB84(dVar123,0);
                      auVar79._0_8_ = dVar123;
                      auVar79._12_4_ = (int)((ulong)dVar123 >> 0x20);
                      auVar80._8_4_ = SUB84(dVar64,0);
                      auVar80._0_8_ = dVar64;
                      auVar80._12_4_ = (int)((ulong)dVar64 >> 0x20);
                      auVar98._0_8_ =
                           dVar126 + dVar123 + ABS(local_560[lVar12 + lVar19 + local_258.nstride * 7
                                                            ]) + dVar64 + 1e-100;
                      auVar98._8_8_ =
                           dVar143 + auVar79._8_8_ +
                                     ABS(local_568[lVar11 + lVar19 + local_258.nstride * 7]) +
                           auVar80._8_8_ + 1e-100;
                      auVar185 = divpd(auVar52,auVar98);
                      auVar81._0_8_ = ABS(local_568[lVar12 + lVar20 + local_258.nstride * 4]);
                      auVar81._8_8_ = ABS(local_568[lVar12 + lVar20 + local_258.nstride * 3]);
                      auVar125._0_8_ = dVar123 + dVar64 + 1e-100;
                      auVar125._8_8_ =
                           dVar126 + ABS(local_5a0[lVar20 + local_258.nstride * 7]) + dVar143 +
                           auVar80._8_8_ + 1e-100;
                      auVar82 = divpd(auVar81,auVar125);
                      auVar83._0_8_ = ABS(local_568[lVar12 + lVar20 + local_258.nstride * 6]);
                      auVar83._8_8_ = ABS(local_568[lVar12 + lVar20 + local_258.nstride * 5]);
                      auVar113._0_8_ = dVar143 + dVar64 + 1e-100;
                      auVar113._8_8_ = dVar64 + dVar126 + 1e-100;
                      auVar84 = divpd(auVar83,auVar113);
                      dVar53 = ((auVar84._8_8_ +
                                 auVar82._8_8_ + auVar185._8_8_ + auVar185._0_8_ + 1.0 +
                                 auVar82._0_8_ + auVar84._0_8_) * dVar64 * (double)local_510[lVar22]
                                * local_568[lVar12 + lVar20 + local_258.nstride * 8] +
                               (auVar180._8_8_ +
                                auVar66._8_8_ + auVar170._8_8_ + 1.0 + auVar170._0_8_ +
                                auVar66._0_8_ + auVar180._0_8_) * dVar122 *
                               (double)local_578[lVar38 + lVar22] *
                               local_568[lVar30 + lVar20 + local_258.nstride * 8] +
                               (auVar146._8_8_ +
                                auVar194._8_8_ + auVar163._8_8_ + auVar163._0_8_ + 1.0 +
                                auVar194._0_8_ + auVar146._0_8_) * dVar131 *
                               (double)local_308[lVar25 + lVar22] *
                               local_2c8[lVar20 + local_258.nstride * 8] +
                               (auVar111._8_8_ +
                                auVar135._8_8_ + auVar97._8_8_ + 1.0 + auVar97._0_8_ +
                                auVar135._0_8_ + auVar111._0_8_) * dVar121 *
                               (double)local_308[lVar38 + lVar22] *
                               local_268[lVar20 + local_258.nstride * 8] +
                               (auVar154._8_8_ +
                                auVar187._8_8_ +
                                ABS(local_568[lVar12 + lVar21 + local_258.nstride * 2]) /
                                (ABS(local_568[lVar11 + lVar21 + local_258.nstride * 7]) + dVar197 +
                                 dVar107 + 1e-100) +
                                ABS(local_568[lVar12 + lVar21 + local_258.nstride]) /
                                (dVar198 + ABS(local_5b8) + dVar107 + 1e-100) + 1.0 + auVar187._0_8_
                               + auVar154._0_8_) * dVar114 * (double)local_510[lVar28] *
                               local_568[lVar12 + lVar21 + local_258.nstride * 8] +
                               (auVar167._8_8_ +
                                auVar133._8_8_ +
                                ABS(local_568[lVar30 + lVar21 + local_258.nstride * 2]) /
                                (dVar142 + dVar171 +
                                 ABS(local_568[lVar30 + lVar21 + local_258.nstride * 7]) + 1e-100) +
                                ABS(local_568[lVar29 + lVar21 + local_258.nstride]) /
                                (dVar175 + ABS(local_2c0[lVar21 + local_258.nstride * 7]) + dVar142
                                + 1e-100) + 1.0 + auVar133._0_8_ + auVar167._0_8_) * dVar176 *
                               (double)local_578[lVar38 + lVar28] *
                               local_568[lVar30 + lVar21 + local_258.nstride * 8] +
                               (auVar152._8_8_ +
                                ABS(local_2e0[local_258.nstride * 3]) /
                                (ABS(local_2e0[local_258.nstride * 7]) + ABS(local_558) + dVar106 +
                                1e-100) + ABS(local_258.p
                                              [lVar33 + lVar12 + lVar21 + local_258.nstride * 2]) /
                                          (ABS(local_300[local_258.nstride * 7]) + dVar106 + dVar159
                                          + 1e-100) +
                                          ABS(local_2c8[lVar21 + local_258.nstride]) /
                                          (dVar120 + dVar159 +
                                           ABS(local_2c8[lVar21 + local_258.nstride * 7]) + 1e-100)
                                          + 1.0 + ABS(local_4f8) / (dVar181 + dVar159 + 1e-100) +
                               auVar152._0_8_) * dVar181 * (double)local_308[lVar25 + lVar28] *
                               local_2c8[lVar21 + local_258.nstride * 8] +
                               (auVar165._8_8_ +
                                ABS(local_2f8[local_258.nstride * 3]) /
                                (ABS(local_2d8[lVar40 + local_258.nstride * 7]) + dVar50 +
                                 ABS(local_2f8[local_258.nstride * 7]) + 1e-100) +
                                ABS(local_258.p[lVar33 + lVar30 + lVar21 + local_258.nstride * 2]) /
                                (dVar141 + dVar50 +
                                 ABS(local_258.p[lVar33 + lVar30 + lVar21 + local_258.nstride * 7])
                                + 1e-100) +
                                ABS(local_2d8[lVar21 + local_258.nstride]) /
                                (dVar76 + dVar141 + ABS(local_398) + 1e-100) + 1.0 +
                                ABS(local_2d0[local_258.nstride * 4]) / (dVar158 + dVar141 + 1e-100)
                               + auVar165._0_8_) * dVar158 * (double)local_308[lVar38 + lVar28] *
                               local_268[lVar21 + local_258.nstride * 8] +
                               auVar90._8_8_ +
                               auVar161._8_8_ +
                               ((double)local_468.p[lVar14 + lVar38 + lVar28] * dVar49) /
                               ((dVar157 + dVar105) * dVar140 + dVar49 + (dVar75 + dVar174) * dVar96
                                + (dVar105 + dVar174) * dVar119 + 1e-100) +
                               (dVar47 * (double)local_468.p[lVar14 + lVar25 + lVar28]) /
                               ((dVar95 + dVar63) * dVar156 + dVar47 + (dVar95 + dVar104) * dVar46 +
                                (dVar72 + dVar104) * dVar62 + 1e-100) +
                               ((double)local_468.p[lVar14 + lVar38 + lVar22] * dVar48) /
                               (dVar48 + (dVar196 + dVar183) * dVar150 +
                                         (dVar173 + dVar196) * dVar103 + (dVar183 + dVar74) * dVar73
                               + 1e-100) +
                               ((double)local_468.p[lVar14 + lVar25 + lVar22] * dVar172) /
                               (dVar172 + (dVar89 + dVar195) * dVar71 +
                                          (dVar190 + dVar149) * dVar182 +
                                          (dVar89 + dVar190) * dVar61 + 1e-100) +
                               ((double)local_308[lVar38 + local_580] * dVar102) /
                               ((dVar94 + dVar88) * dVar130 + dVar102 + (dVar70 + dVar139) * dVar45
                                + (dVar88 + dVar139) * dVar118 + 1e-100) +
                               (dVar129 * (double)local_308[lVar25 + local_580]) /
                               ((dVar69 + dVar60) * dVar101 + dVar129 + (dVar69 + dVar138) * dVar93
                                + (dVar87 + dVar138) * dVar117 + 1e-100) +
                               ((double)local_578[lVar38 + local_580] * dVar44) /
                               (dVar44 + (dVar116 + dVar86) * dVar128 + (dVar68 + dVar116) * dVar92
                                + (dVar86 + dVar137) * dVar100 + 1e-100) +
                               ((double)local_510[local_580] * dVar99) /
                               (dVar99 + (dVar67 + dVar136) * dVar59 +
                                         (dVar127 + dVar85) * dVar115 + (dVar67 + dVar127) * dVar91
                               + 1e-100) +
                               (double)local_468.p[lVar14 + lVar37 + local_580] + dVar53 + dVar54 +
                               dVar55 + dVar56 + dVar57 + dVar58 + auVar161._0_8_ + auVar90._0_8_) *
                               0.125;
                      local_598 = uVar34;
                    }
                    local_318[uVar34 - local_4b8] = dVar53;
                    uVar34 = uVar34 + 1;
                  } while (local_5d4.bigend.vect[0] + 1U != (int)uVar34);
                }
                uVar5 = (uint)local_530 + 1;
                bVar43 = (uint)local_530 != local_5d4.bigend.vect[1];
                local_530 = (ulong)uVar5;
              } while (bVar43);
            }
            uVar5 = (uint)local_538 + 1;
            bVar43 = (uint)local_538 != local_5d4.bigend.vect[2];
            local_538 = (ulong)uVar5;
          } while (bVar43);
        }
      }
      MFIter::operator++((MFIter *)&local_218);
      pMVar36 = local_4d8;
    } while (local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
             local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]);
  }
  MFIter::~MFIter((MFIter *)&local_218);
  if (bVar41 || !bVar4) {
    period = Periodicity::NonPeriodic();
    FabArray<amrex::FArrayBox>::ParallelCopy(local_388,&local_1b0,period,COPY);
  }
  MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return;
}

Assistant:

void
MLNodeLaplacian::restriction (int amrlev, int cmglev, MultiFab& crse, MultiFab& fine) const
{
    BL_PROFILE("MLNodeLaplacian::restriction()");

    applyBC(amrlev, cmglev-1, fine, BCMode::Homogeneous, StateMode::Solution);

    bool need_parallel_copy = !amrex::isMFIterSafe(crse, fine);
    MultiFab cfine;
    if (need_parallel_copy) {
        const BoxArray& ba = amrex::coarsen(fine.boxArray(), 2);
        cfine.define(ba, fine.DistributionMap(), 1, 0);
    }

    MultiFab* pcrse = (need_parallel_copy) ? &cfine : &crse;
    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][cmglev-1];

    const auto& stencil = m_stencil[amrlev][cmglev-1];

    bool regular_coarsening = true; int idir = 2;
    if (cmglev > 0) {
        regular_coarsening = mg_coarsen_ratio_vec[cmglev-1] == mg_coarsen_ratio;
        IntVect ratio = mg_coarsen_ratio_vec[cmglev-1];
        if (ratio[1] == 1) {
            idir = 1;
        } else if (ratio[0] == 1) {
            idir = 0;
        }
    }

#ifdef AMREX_USE_GPU
    auto pcrse_ma = pcrse->arrays();
    auto fine_ma = fine.const_arrays();
    auto msk_ma = dmsk.const_arrays();

    if (Gpu::inLaunchRegion()) {
        if (m_coarsening_strategy == CoarseningStrategy::Sigma)
        {
            if (regular_coarsening)
            {
                ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
                {
                    mlndlap_restriction(i,j,k,pcrse_ma[box_no],fine_ma[box_no],msk_ma[box_no]);
                });
            }
            else
            {
                ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
                {
                    mlndlap_semi_restriction(i,j,k,pcrse_ma[box_no],fine_ma[box_no],msk_ma[box_no],idir);
                });
            }
        }
        else
        {
            auto st_ma = stencil->const_arrays();
            ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
                mlndlap_restriction_rap(i,j,k,pcrse_ma[box_no],fine_ma[box_no],st_ma[box_no],msk_ma[box_no]);
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*pcrse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> cfab = pcrse->array(mfi);
            Array4<Real const> const& ffab = fine.const_array(mfi);
            Array4<int const> const& mfab = dmsk.const_array(mfi);
            if (m_coarsening_strategy == CoarseningStrategy::Sigma)
            {
                if (regular_coarsening)
                {
                    amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                    {
                        mlndlap_restriction(i,j,k,cfab,ffab,mfab);
                    });
                }
                else
                {
                    amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                    {
                        mlndlap_semi_restriction(i,j,k,cfab,ffab,mfab,idir);
                    });
                }
            }
            else
            {
                Array4<Real const> const& stfab = stencil->const_array(mfi);
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    mlndlap_restriction_rap(i,j,k,cfab,ffab,stfab,mfab);
                });
            }
        }
    }

    if (need_parallel_copy) {
        crse.ParallelCopy(cfine);
    }
}